

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-open.c
# Opt level: O0

void close_socket(uv_os_sock_t sock)

{
  int iVar1;
  int r;
  uv_os_sock_t sock_local;
  
  iVar1 = close(sock);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-open.c"
            ,0x4f,"r == 0");
    abort();
  }
  return;
}

Assistant:

static void close_socket(uv_os_sock_t sock) {
  int r;
#ifdef _WIN32
  r = closesocket(sock);
#else
  r = close(sock);
#endif
  ASSERT(r == 0);
}